

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::XmlUnitTestResultPrinter::OnTestIterationEnd
          (XmlUnitTestResultPrinter *this,UnitTest *unit_test,int param_2)

{
  bool bVar1;
  char *path;
  ostream *poVar2;
  undefined8 uVar3;
  ostream *local_228;
  string local_218;
  stringstream local_1f8 [8];
  stringstream stream;
  ostream aoStack_1e8 [380];
  GTestLog local_6c;
  undefined1 local_68 [8];
  FilePath output_dir;
  FilePath output_file;
  FILE *xmlout;
  int param_2_local;
  UnitTest *unit_test_local;
  XmlUnitTestResultPrinter *this_local;
  
  output_file.pathname_.field_2._8_8_ = 0;
  FilePath::FilePath((FilePath *)((long)&output_dir.pathname_.field_2 + 8),&this->output_file_);
  FilePath::RemoveFileName
            ((FilePath *)local_68,(FilePath *)((long)&output_dir.pathname_.field_2 + 8));
  bVar1 = FilePath::CreateDirectoriesRecursively((FilePath *)local_68);
  if (bVar1) {
    path = (char *)std::__cxx11::string::c_str();
    output_file.pathname_.field_2._8_8_ = posix::FOpen(path,"w");
  }
  if (output_file.pathname_.field_2._8_8_ == 0) {
    GTestLog::GTestLog(&local_6c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/third_party/gtest/googletest/src/gtest.cc"
                       ,0xdaa);
    poVar2 = GTestLog::GetStream(&local_6c);
    poVar2 = std::operator<<(poVar2,"Unable to open file \"");
    poVar2 = std::operator<<(poVar2,(string *)&this->output_file_);
    std::operator<<(poVar2,"\"");
    GTestLog::~GTestLog(&local_6c);
  }
  std::__cxx11::stringstream::stringstream(local_1f8);
  local_228 = (ostream *)0x0;
  if (&stack0x00000000 != (undefined1 *)0x1f8) {
    local_228 = aoStack_1e8;
  }
  PrintXmlUnitTest(local_228,unit_test);
  StringStreamToString(&local_218,(stringstream *)local_1f8);
  uVar3 = std::__cxx11::string::c_str();
  fprintf((FILE *)output_file.pathname_.field_2._8_8_,"%s",uVar3);
  std::__cxx11::string::~string((string *)&local_218);
  fclose((FILE *)output_file.pathname_.field_2._8_8_);
  std::__cxx11::stringstream::~stringstream(local_1f8);
  FilePath::~FilePath((FilePath *)local_68);
  FilePath::~FilePath((FilePath *)((long)&output_dir.pathname_.field_2 + 8));
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OnTestIterationEnd(const UnitTest& unit_test,
                                                  int /*iteration*/) {
  FILE* xmlout = NULL;
  FilePath output_file(output_file_);
  FilePath output_dir(output_file.RemoveFileName());

  if (output_dir.CreateDirectoriesRecursively()) {
    xmlout = posix::FOpen(output_file_.c_str(), "w");
  }
  if (xmlout == NULL) {
    // TODO(wan): report the reason of the failure.
    //
    // We don't do it for now as:
    //
    //   1. There is no urgent need for it.
    //   2. It's a bit involved to make the errno variable thread-safe on
    //      all three operating systems (Linux, Windows, and Mac OS).
    //   3. To interpret the meaning of errno in a thread-safe way,
    //      we need the strerror_r() function, which is not available on
    //      Windows.

    GTEST_LOG_(FATAL) << "Unable to open file \"" << output_file_ << "\"";
  }
  std::stringstream stream;
  PrintXmlUnitTest(&stream, unit_test);
  fprintf(xmlout, "%s", StringStreamToString(&stream).c_str());
  fclose(xmlout);
}